

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

int fy_fetch_block_entry(fy_parser *fyp,int c)

{
  list_head **pplVar1;
  int iVar2;
  fy_atom *pfVar3;
  fy_atom *pfVar4;
  fy_token *pfVar5;
  list_head *plVar6;
  fy_atom *pfVar7;
  int line;
  char *pcVar8;
  list_head *plVar9;
  list_head *plVar10;
  fy_atom local_88;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  fy_diag_report_ctx _drc;
  
  if (c != 0x2d) {
    pcVar8 = "illegal block entry";
    iVar2 = 0x72c;
    goto LAB_0012fb92;
  }
  iVar2 = fyp->flow_level;
  if (iVar2 == 0) {
LAB_0012fafc:
    if ((fyp->field_0x70 & 8) == 0) {
      if (fyp->state == FYPS_BLOCK_MAPPING_VALUE) {
        _drc.type = FYET_DEBUG;
        _drc.module = FYEM_UNKNOWN;
        _drc.fyt = (fy_token *)0x0;
        _drc.has_override = false;
        _drc._17_7_ = 0;
        _drc.override_file = (char *)0x0;
        auStack_48._0_4_ = FYET_ERROR;
        auStack_48._4_4_ = FYEM_SCAN;
        pfVar4 = &local_88;
        pfVar3 = fy_fill_atom_at(fyp,0,1,pfVar4);
        _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
        pcVar8 = "block sequence on the same line as a mapping key";
      }
      else if (fyp->state - FYPS_BLOCK_SEQUENCE_FIRST_ENTRY < 2) {
        _drc.type = FYET_DEBUG;
        _drc.module = FYEM_UNKNOWN;
        _drc.fyt = (fy_token *)0x0;
        _drc.has_override = false;
        _drc._17_7_ = 0;
        _drc.override_file = (char *)0x0;
        auStack_48._0_4_ = FYET_ERROR;
        auStack_48._4_4_ = FYEM_SCAN;
        pfVar4 = &local_88;
        pfVar3 = fy_fill_atom_at(fyp,0,1,pfVar4);
        _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
        pcVar8 = "block sequence on the same line as a previous item";
      }
      else {
        _drc.type = FYET_DEBUG;
        _drc.module = FYEM_UNKNOWN;
        _drc.fyt = (fy_token *)0x0;
        _drc.has_override = false;
        _drc._17_7_ = 0;
        _drc.override_file = (char *)0x0;
        auStack_48._0_4_ = FYET_ERROR;
        auStack_48._4_4_ = FYEM_SCAN;
        pfVar4 = &local_88;
        pfVar3 = fy_fill_atom_at(fyp,0,1,pfVar4);
        _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
        pcVar8 = "block sequence entries not allowed in this context";
      }
      goto LAB_0012fec7;
    }
    pfVar3 = (fy_atom *)auStack_48;
    if ((iVar2 == 0) && (pfVar3 = (fy_atom *)auStack_48, fyp->indent < fyp->column)) {
      uStack_50 = 0x12fc1a;
      iVar2 = fy_push_indent(fyp,fyp->column,false);
      if (iVar2 != 0) {
        pcVar8 = "fy_push_indent() failed";
        iVar2 = 0x748;
LAB_0012fb92:
        uStack_50 = 0x12fb99;
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,iVar2,"fy_fetch_block_entry",pcVar8);
        return -1;
      }
      pfVar3 = &local_88;
      iVar2 = 0;
      pfVar4 = fy_fill_atom(fyp,0,pfVar3);
      pfVar5 = fy_token_queue_internal(fyp,&fyp->queued_tokens,FYTT_BLOCK_SEQUENCE_START,pfVar4);
      if (pfVar5 == (fy_token *)0x0) {
        pcVar8 = "fy_token_queue_internal() failed";
        line = 0x74d;
        goto LAB_0012fe40;
      }
    }
  }
  else {
    if (fyp->column + 2 <= fyp->indent) {
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      auStack_48._0_4_ = FYET_ERROR;
      auStack_48._4_4_ = FYEM_SCAN;
      pfVar4 = &local_88;
      pfVar3 = fy_fill_atom_at(fyp,0,1,pfVar4);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar3);
      pcVar8 = "wrongly indented block sequence in flow mode";
      goto LAB_0012fec7;
    }
    pfVar3 = (fy_atom *)auStack_48;
    if (iVar2 == 0) goto LAB_0012fafc;
  }
  plVar6 = (fyp->simple_keys)._lh.next;
  if (plVar6 == (list_head *)0x0 || plVar6 == &(fyp->simple_keys)._lh) {
    plVar10 = (list_head *)0x0;
  }
  else {
    plVar9 = (list_head *)0x0;
    do {
      plVar10 = plVar9;
      if ((*(int *)&plVar6[3].prev < fyp->flow_level) ||
         (plVar10 = plVar6, ((ulong)plVar6[3].prev & 0x100000000) != 0)) break;
      pplVar1 = &plVar6->next;
      plVar6 = *pplVar1;
      if (*pplVar1 == &(fyp->simple_keys)._lh) {
        plVar6 = plVar9;
      }
      plVar10 = plVar9;
    } while (plVar6 != (list_head *)0x0);
  }
  if (plVar10 == (list_head *)0x0) {
    *(undefined8 *)&pfVar3[-1].increment = 0x12fe13;
    iVar2 = fy_remove_simple_key(fyp,FYTT_BLOCK_ENTRY);
    if (iVar2 == 0) {
      fyp->field_0x70 = fyp->field_0x70 | 8;
      pfVar3[-1].fyi = (fy_input *)"true";
      pfVar3[-1].storage_hint = 0x12ff25;
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x76c,"fy_fetch_block_entry","simple_key_allowed -> %s\n");
      pfVar3[-2].fyi = (fy_input *)0x12ff3e;
      pfVar4 = fy_fill_atom(fyp,1,(fy_atom *)&pfVar3[-2].increment);
      pfVar3[-2].fyi = (fy_input *)0x12ff50;
      pfVar5 = fy_token_queue(fyp,FYTT_BLOCK_ENTRY,pfVar4);
      if (pfVar5 != (fy_token *)0x0) {
        pfVar3[-2].fyi = (fy_input *)0x12ff5f;
        iVar2 = fy_parse_peek_at_offset(fyp,0);
        if ((iVar2 != 0x20) && (iVar2 != 9)) {
          return 0;
        }
        pfVar3[-2].fyi = (fy_input *)0x12ff77;
        fy_advance(fyp,iVar2);
        return 0;
      }
      pcVar8 = "fy_token_queue() failed";
      iVar2 = 0;
      line = 0x770;
      pfVar3 = (fy_atom *)&pfVar3[-2].increment;
    }
    else {
      pcVar8 = "fy_remove_simple_key() failed";
      line = 0x769;
    }
LAB_0012fe40:
    *(undefined8 *)&pfVar3[-1].increment = 0x12fe47;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,line,"fy_fetch_block_entry",pcVar8);
    return iVar2;
  }
  pfVar5 = (fy_token *)plVar10[3].next;
  if (pfVar5 == (fy_token *)0x0) {
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    auStack_48._0_4_ = FYET_ERROR;
    auStack_48._4_4_ = FYEM_SCAN;
    pfVar4 = (fy_atom *)&pfVar3[-2].increment;
    pfVar3[-2].fyi = (fy_input *)0x12fe88;
    pfVar7 = fy_fill_atom_at(fyp,0,1,pfVar4);
    pfVar3[-2].fyi = (fy_input *)0x12fe97;
    _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
  }
  else {
    if (pfVar5->type - FYTT_ANCHOR < 2) {
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      auStack_48._0_4_ = FYET_ERROR;
      auStack_48._4_4_ = FYEM_SCAN;
      *(undefined8 *)&pfVar3[-1].increment = 0x12fdcf;
      _drc._0_8_ = fy_token_ref(pfVar5);
      pcVar8 = "tag";
      if (*(int *)&plVar10[3].next[1].next == 0x13) {
        pcVar8 = "anchor";
      }
      *(undefined8 *)&pfVar3[-1].increment = 0x12fe01;
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_48,"invalid %s indent for sequence",pcVar8);
      return -1;
    }
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    auStack_48._0_4_ = FYET_ERROR;
    auStack_48._4_4_ = FYEM_SCAN;
    *(undefined8 *)&pfVar3[-1].increment = 0x12febc;
    _drc._0_8_ = fy_token_ref(pfVar5);
    pfVar4 = pfVar3;
  }
  pcVar8 = "missing \':\'";
LAB_0012fec7:
  *(undefined8 *)&pfVar4[-1].increment = 0x12fed4;
  fy_parser_diag_report(fyp,(fy_diag_report_ctx *)auStack_48,pcVar8);
  return -1;
}

Assistant:

int fy_fetch_block_entry(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key *fysk;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '-', err_out,
                    "illegal block entry");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || (fyp->column + 2) > fyp->indent, err_out,
                          "wrongly indented block sequence in flow mode");

    if (!(fyp->flow_level || fyp->simple_key_allowed)) {
        if (!fyp->simple_key_allowed && fyp->state == FYPS_BLOCK_MAPPING_VALUE)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a mapping key");
        else if (fyp->state == FYPS_BLOCK_SEQUENCE_FIRST_ENTRY ||
                 fyp->state == FYPS_BLOCK_SEQUENCE_ENTRY)
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence on the same line as a previous item");
        else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "block sequence entries not allowed in this context");
        goto err_out;
    }

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_SEQUENCE_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (c == '-' && fyp->flow_level) {
        /* this is an error, but we let the parser catch it */
        ;
    }

    fysk = fy_would_remove_required_simple_key(fyp);

    if (fysk) {
        if (fysk->token) {
            if (fysk->token->type == FYTT_ANCHOR || fysk->token->type == FYTT_TAG)
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "invalid %s indent for sequence",
                                fysk->token->type == FYTT_ANCHOR ?
                                "anchor" : "tag");
            else
                FYP_TOKEN_ERROR(fyp, fysk->token, FYEM_SCAN,
                                "missing ':'");
        } else
            FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN,
                            "missing ':'");
        goto err_out;
    }

    rc = fy_remove_simple_key(fyp, FYTT_BLOCK_ENTRY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    fyp->simple_key_allowed = true;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    fyt = fy_token_queue(fyp, FYTT_BLOCK_ENTRY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    /* special case for allowing whitespace (including tabs) after - */
    if (fy_is_ws(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}